

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalize_func.c
# Opt level: O0

void xc_mgga_evaluate_functional
               (xc_func_type *func,size_t np,double *rho,double *sigma,double *lapl,double *tau,
               double *zk,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
               double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
               double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,
               double *v2tau2,double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,
               double *v3rho2tau,double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,
               double *v3rholapl2,double *v3rholapltau,double *v3rhotau2,double *v3sigma3,
               double *v3sigma2lapl,double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,
               double *v3sigmatau2,double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,
               double *v3tau3,double *v4rho4,double *v4rho3sigma,double *v4rho3lapl,
               double *v4rho3tau,double *v4rho2sigma2,double *v4rho2sigmalapl,double *v4rho2sigmatau
               ,double *v4rho2lapl2,double *v4rho2lapltau,double *v4rho2tau2,double *v4rhosigma3,
               double *v4rhosigma2lapl,double *v4rhosigma2tau,double *v4rhosigmalapl2,
               double *v4rhosigmalapltau,double *v4rhosigmatau2,double *v4rholapl3,
               double *v4rholapl2tau,double *v4rholapltau2,double *v4rhotau3,double *v4sigma4,
               double *v4sigma3lapl,double *v4sigma3tau,double *v4sigma2lapl2,
               double *v4sigma2lapltau,double *v4sigma2tau2,double *v4sigmalapl3,
               double *v4sigmalapl2tau,double *v4sigmalapltau2,double *v4sigmatau3,double *v4lapl4,
               double *v4lapl3tau,double *v4lapl2tau2,double *v4lapltau3,double *v4tau4)

{
  int iVar1;
  double *in_RCX;
  double *in_RDX;
  double *unaff_RBX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double *in_R9;
  double *unaff_R12;
  double *unaff_R13;
  double *unaff_R14;
  double *in_stack_00000008;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  size_t in_stack_00000038;
  xc_func_type *in_stack_00000040;
  double *in_stack_00000050;
  double *in_stack_00000058;
  double *in_stack_00000060;
  double *in_stack_00000068;
  double *in_stack_00000070;
  double *in_stack_00000078;
  double *in_stack_00000080;
  double *in_stack_00000088;
  double *in_stack_00000090;
  double *in_stack_00000098;
  double *in_stack_000000a0;
  double *in_stack_000000a8;
  double *in_stack_000000b0;
  double *in_stack_000000b8;
  double *in_stack_000000c0;
  double *in_stack_000000c8;
  double *in_stack_000000d0;
  double *in_stack_000000d8;
  double *in_stack_000000e0;
  double *in_stack_000000e8;
  double *in_stack_000000f0;
  double *in_stack_000000f8;
  double *in_stack_00000100;
  double *in_stack_00000108;
  double *in_stack_00000110;
  double *in_stack_00000118;
  double *in_stack_00000120;
  double *in_stack_00000128;
  double *in_stack_00000130;
  double *in_stack_00000138;
  double *in_stack_00000140;
  double *in_stack_00000148;
  double *in_stack_00000150;
  double *in_stack_00000158;
  double *in_stack_00000160;
  double *in_stack_00000168;
  double *in_stack_00000170;
  double *in_stack_00000178;
  double *in_stack_00000180;
  double *in_stack_00000188;
  double *in_stack_00000190;
  double *in_stack_00000198;
  double *in_stack_000001a0;
  double *in_stack_000001a8;
  double *in_stack_000001b0;
  double *in_stack_000001b8;
  double *in_stack_000001c0;
  double *in_stack_000001c8;
  double *in_stack_000001d0;
  double *in_stack_000001d8;
  double *in_stack_000001e0;
  double *in_stack_000001e8;
  double *in_stack_00000230;
  double *mzk;
  double *in_stack_fffffffffffffb78;
  double *in_stack_fffffffffffffb80;
  double *in_stack_fffffffffffffb88;
  double *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  xc_func_type *in_stack_fffffffffffffba0;
  double *in_stack_fffffffffffffbb0;
  double *in_stack_fffffffffffffbb8;
  double *in_stack_fffffffffffffbc8;
  double *in_stack_fffffffffffffbd0;
  double *in_stack_fffffffffffffbd8;
  double *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  xc_func_type *in_stack_fffffffffffffbf0;
  double *in_stack_fffffffffffffc00;
  double *in_stack_fffffffffffffc08;
  double *in_stack_fffffffffffffc10;
  double *in_stack_fffffffffffffc18;
  double *in_stack_fffffffffffffc20;
  double *in_stack_fffffffffffffc28;
  double *in_stack_fffffffffffffc30;
  double *in_stack_fffffffffffffc38;
  double *in_stack_fffffffffffffc40;
  double *in_stack_fffffffffffffc48;
  double *in_stack_fffffffffffffc50;
  double *in_stack_fffffffffffffc58;
  double *in_stack_fffffffffffffc60;
  double *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  double *v4sigma2lapltau_00;
  
  v4sigma2lapltau_00 = (double *)0x0;
  if ((*(uint *)((long)*in_RDI + 0x40) & 1) != 0) {
    v4sigma2lapltau_00 = in_stack_00000008;
  }
  iVar1 = *(int *)((long)*in_RDI + 0x10);
  if (iVar1 == 1) {
LAB_01bf2fa7:
    xc_lda(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
           in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
           in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8);
    return;
  }
  if (iVar1 == 2) {
LAB_01bf2ffa:
    xc_gga(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
           in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
           in_stack_fffffffffffffc00,in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,
           in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,
           in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,in_stack_fffffffffffffc40,
           in_stack_fffffffffffffc48,in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,
           in_stack_fffffffffffffc60);
  }
  else {
    if (iVar1 != 4) {
      if (iVar1 == 0x20) goto LAB_01bf2ffa;
      if (iVar1 != 0x40) {
        if (iVar1 != 0x80) {
          return;
        }
        goto LAB_01bf2fa7;
      }
    }
    xc_mgga(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
            in_stack_00000020,in_stack_00000018,in_stack_00000050,in_stack_00000058,
            in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,
            in_stack_00000080,in_stack_00000088,in_stack_00000090,in_stack_00000098,
            in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
            in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,in_stack_000000d8,
            in_stack_000000e0,in_stack_000000e8,in_stack_000000f0,in_stack_000000f8,
            in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000118,
            in_stack_00000120,in_stack_00000128,in_stack_00000130,in_stack_00000138,
            in_stack_00000140,in_stack_00000148,in_stack_00000150,in_stack_00000158,
            in_stack_00000160,in_stack_00000168,in_stack_00000170,in_stack_00000178,
            in_stack_00000180,in_stack_00000188,in_stack_00000190,in_stack_00000198,
            in_stack_000001a0,in_stack_000001a8,in_stack_000001b0,in_stack_000001b8,
            in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,in_stack_000001d8,
            in_stack_000001e0,in_stack_000001e8,in_stack_00000230,in_stack_ffffffffffffff68,
            in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
            in_stack_ffffffffffffff88,(double *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
            v4sigma2lapltau_00,in_R9,in_R8,in_RCX,in_RDX,in_RSI,in_RDI,unaff_RBX,unaff_R12,unaff_R13
            ,unaff_R14);
  }
  return;
}

Assistant:

void
xc_mgga_evaluate_functional(const xc_func_type *func, size_t np,
                            const double *rho, const double *sigma, const double *lapl, const double *tau,
                            double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  double *mzk = NULL;

  if(func->info->flags & XC_FLAGS_HAVE_EXC)
    mzk = zk;
  
  /* Evaluate the functional */
  switch(func->info->family){
  case XC_FAMILY_LDA:
  case XC_FAMILY_HYB_LDA:
    xc_lda(func, np, rho,
           mzk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  case XC_FAMILY_GGA:
  case XC_FAMILY_HYB_GGA:
    xc_gga(func, np, rho, sigma,
           mzk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  case XC_FAMILY_MGGA:
  case XC_FAMILY_HYB_MGGA:
    xc_mgga(func, np, rho, sigma, lapl, tau,
            mzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  }
}